

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipc.c
# Opt level: O2

void nn_cipc_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  nn_ep *pnVar4;
  ulong uVar5;
  undefined8 uVar6;
  
  uVar5 = (ulong)(uint)src;
  switch(*(undefined4 *)&self[1].fn) {
  case 1:
    if (src == -2) {
      if (type == -2) {
LAB_0011fccf:
        nn_cipc_start_connecting((nn_cipc *)self);
        return;
      }
      nn_backtrace_print();
      uVar2 = (ulong)*(uint *)&self[1].fn;
      pcVar3 = "Unexpected action";
      uVar5 = 0xfffffffffffffffe;
      uVar6 = 0xce;
    }
    else {
      nn_backtrace_print();
      uVar2 = (ulong)*(uint *)&self[1].fn;
      pcVar3 = "Unexpected source";
      uVar6 = 0xd2;
    }
    break;
  case 2:
    if (src == 1) {
      if (type == 5) {
        pnVar4 = (nn_ep *)self[1].shutdown_fn;
        iVar1 = nn_usock_geterrno((nn_usock *)&self[1].state);
        nn_ep_set_error(pnVar4,iVar1);
        nn_usock_stop((nn_usock *)&self[1].state);
        *(undefined4 *)&self[1].fn = 5;
        nn_ep_stat_increment((nn_ep *)self[1].shutdown_fn,0xca,-1);
        pnVar4 = (nn_ep *)self[1].shutdown_fn;
        iVar1 = 0x69;
LAB_0011fd22:
        nn_ep_stat_increment(pnVar4,iVar1,1);
        return;
      }
      if (type == 1) {
        nn_sipc_start((nn_sipc *)&self[10].stopped.item,(nn_usock *)&self[1].state);
        *(undefined4 *)&self[1].fn = 3;
        nn_ep_stat_increment((nn_ep *)self[1].shutdown_fn,0xca,-1);
        nn_ep_stat_increment((nn_ep *)self[1].shutdown_fn,0x65,1);
        nn_ep_clear_error((nn_ep *)self[1].shutdown_fn);
        return;
      }
      nn_backtrace_print();
      uVar2 = (ulong)*(uint *)&self[1].fn;
      pcVar3 = "Unexpected action";
      uVar5 = 1;
      uVar6 = 0xf0;
    }
    else {
      nn_backtrace_print();
      uVar2 = (ulong)*(uint *)&self[1].fn;
      pcVar3 = "Unexpected source";
      uVar6 = 0xf4;
    }
    break;
  case 3:
    if (src == 3) {
      if (type == 1) {
        nn_sipc_stop((nn_sipc *)&self[10].stopped.item);
        *(undefined4 *)&self[1].fn = 4;
        pnVar4 = (nn_ep *)self[1].shutdown_fn;
        iVar1 = 0x68;
        goto LAB_0011fd22;
      }
      nn_backtrace_print();
      uVar2 = (ulong)*(uint *)&self[1].fn;
      pcVar3 = "Unexpected action";
      uVar5 = 3;
      uVar6 = 0x106;
    }
    else {
      nn_backtrace_print();
      uVar2 = (ulong)*(uint *)&self[1].fn;
      pcVar3 = "Unexpected source";
      uVar6 = 0x10a;
    }
    break;
  case 4:
    if (src == 3) {
      if (type != 8) {
        if (type != 2) {
          nn_backtrace_print();
          uVar2 = (ulong)*(uint *)&self[1].fn;
          pcVar3 = "Unexpected action";
          uVar5 = 3;
          uVar6 = 0x11d;
          break;
        }
        nn_usock_stop((nn_usock *)&self[1].state);
        *(undefined4 *)&self[1].fn = 5;
      }
      return;
    }
    nn_backtrace_print();
    uVar2 = (ulong)*(uint *)&self[1].fn;
    pcVar3 = "Unexpected source";
    uVar6 = 0x121;
    break;
  case 5:
    if (src == 1) {
      if (type == 8) {
        return;
      }
      if (type == 7) {
        nn_backoff_start((nn_backoff *)&self[8].shutdown_fn);
        *(undefined4 *)&self[1].fn = 6;
        return;
      }
      nn_backtrace_print();
      uVar2 = (ulong)*(uint *)&self[1].fn;
      pcVar3 = "Unexpected action";
      uVar5 = 1;
      uVar6 = 0x134;
    }
    else {
      nn_backtrace_print();
      uVar2 = (ulong)*(uint *)&self[1].fn;
      pcVar3 = "Unexpected source";
      uVar6 = 0x138;
    }
    break;
  case 6:
    if (src == 2) {
      if (type == 1) {
        nn_backoff_stop((nn_backoff *)&self[8].shutdown_fn);
        *(undefined4 *)&self[1].fn = 7;
        return;
      }
      nn_backtrace_print();
      uVar2 = (ulong)*(uint *)&self[1].fn;
      pcVar3 = "Unexpected action";
      uVar5 = 2;
      uVar6 = 0x14a;
    }
    else {
      nn_backtrace_print();
      uVar2 = (ulong)*(uint *)&self[1].fn;
      pcVar3 = "Unexpected source";
      uVar6 = 0x14e;
    }
    break;
  case 7:
    if (src == 2) {
      if (type == 2) goto LAB_0011fccf;
      nn_backtrace_print();
      uVar2 = (ulong)*(uint *)&self[1].fn;
      pcVar3 = "Unexpected action";
      uVar5 = 2;
      uVar6 = 0x15e;
    }
    else {
      nn_backtrace_print();
      uVar2 = (ulong)*(uint *)&self[1].fn;
      pcVar3 = "Unexpected source";
      uVar6 = 0x162;
    }
    break;
  default:
    nn_backtrace_print();
    uVar2 = (ulong)*(uint *)&self[1].fn;
    pcVar3 = "Unexpected state";
    uVar6 = 0x169;
  }
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n",pcVar3,uVar2,uVar5,(ulong)(uint)type,
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/cipc.c"
          ,uVar6);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_cipc_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_cipc *cipc;

    cipc = nn_cont (self, struct nn_cipc, fsm);

    switch (cipc->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/*  The state machine wasn't yet started.                                     */
/******************************************************************************/
    case NN_CIPC_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_cipc_start_connecting (cipc);
                return;
            default:
                nn_fsm_bad_action (cipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (cipc->state, src, type);
        }

/******************************************************************************/
/*  CONNECTING state.                                                         */
/*  Non-blocking connect is under way.                                        */
/******************************************************************************/
    case NN_CIPC_STATE_CONNECTING:
        switch (src) {

        case NN_CIPC_SRC_USOCK:
            switch (type) {
            case NN_USOCK_CONNECTED:
                nn_sipc_start (&cipc->sipc, &cipc->usock);
                cipc->state = NN_CIPC_STATE_ACTIVE;
                nn_ep_stat_increment (cipc->ep,
                    NN_STAT_INPROGRESS_CONNECTIONS, -1);
                nn_ep_stat_increment (cipc->ep,
                    NN_STAT_ESTABLISHED_CONNECTIONS, 1);
                nn_ep_clear_error (cipc->ep);
                return;
            case NN_USOCK_ERROR:
                nn_ep_set_error (cipc->ep, nn_usock_geterrno (&cipc->usock));
                nn_usock_stop (&cipc->usock);
                cipc->state = NN_CIPC_STATE_STOPPING_USOCK;
                nn_ep_stat_increment (cipc->ep,
                    NN_STAT_INPROGRESS_CONNECTIONS, -1);
                nn_ep_stat_increment (cipc->ep, NN_STAT_CONNECT_ERRORS, 1);
                return;
            default:
                nn_fsm_bad_action (cipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (cipc->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/*  Connection is established and handled by the sipc state machine.          */
/******************************************************************************/
    case NN_CIPC_STATE_ACTIVE:
        switch (src) {

        case NN_CIPC_SRC_SIPC:
            switch (type) {
            case NN_SIPC_ERROR:
                nn_sipc_stop (&cipc->sipc);
                cipc->state = NN_CIPC_STATE_STOPPING_SIPC;
                nn_ep_stat_increment (cipc->ep, NN_STAT_BROKEN_CONNECTIONS, 1);
                return;
            default:
               nn_fsm_bad_action (cipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (cipc->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_SIPC state.                                                      */
/*  sipc object was asked to stop but it haven't stopped yet.                 */
/******************************************************************************/
    case NN_CIPC_STATE_STOPPING_SIPC:
        switch (src) {

        case NN_CIPC_SRC_SIPC:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_SIPC_STOPPED:
                nn_usock_stop (&cipc->usock);
                cipc->state = NN_CIPC_STATE_STOPPING_USOCK;
                return;
            default:
                nn_fsm_bad_action (cipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (cipc->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_USOCK state.                                                     */
/*  usock object was asked to stop but it haven't stopped yet.                */
/******************************************************************************/
    case NN_CIPC_STATE_STOPPING_USOCK:
        switch (src) {

        case NN_CIPC_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_USOCK_STOPPED:
                nn_backoff_start (&cipc->retry);
                cipc->state = NN_CIPC_STATE_WAITING;
                return;
            default:
                nn_fsm_bad_action (cipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (cipc->state, src, type);
        }

/******************************************************************************/
/*  WAITING state.                                                            */
/*  Waiting before re-connection is attempted. This way we won't overload     */
/*  the system by continuous re-connection attemps.                           */
/******************************************************************************/
    case NN_CIPC_STATE_WAITING:
        switch (src) {

        case NN_CIPC_SRC_RECONNECT_TIMER:
            switch (type) {
            case NN_BACKOFF_TIMEOUT:
                nn_backoff_stop (&cipc->retry);
                cipc->state = NN_CIPC_STATE_STOPPING_BACKOFF;
                return;
            default:
                nn_fsm_bad_action (cipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (cipc->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_BACKOFF state.                                                   */
/*  backoff object was asked to stop, but it haven't stopped yet.             */
/******************************************************************************/
    case NN_CIPC_STATE_STOPPING_BACKOFF:
        switch (src) {

        case NN_CIPC_SRC_RECONNECT_TIMER:
            switch (type) {
            case NN_BACKOFF_STOPPED:
                nn_cipc_start_connecting (cipc);
                return;
            default:
                nn_fsm_bad_action (cipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (cipc->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (cipc->state, src, type);
    }
}